

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O0

short * __thiscall
sisl::cartesian_cubic<short>::operator()(cartesian_cubic<short> *this,int d0,__va_list_tag *vl)

{
  uint uVar1;
  bool bVar2;
  uint *local_78;
  uint *local_60;
  uint local_40;
  uint local_3c;
  int local_38;
  uint local_34;
  uint local_30;
  uint _z;
  uint _y;
  uint _x;
  __va_list_tag *vl_local;
  cartesian_cubic<short> *pcStack_18;
  int d0_local;
  cartesian_cubic<short> *this_local;
  
  uVar1 = vl->gp_offset;
  if (uVar1 < 0x29) {
    local_60 = (uint *)((long)(int)uVar1 + (long)vl->reg_save_area);
    vl->gp_offset = uVar1 + 8;
  }
  else {
    local_60 = (uint *)vl->overflow_arg_area;
    vl->overflow_arg_area = local_60 + 2;
  }
  local_3c = *local_60;
  uVar1 = vl->gp_offset;
  if (uVar1 < 0x29) {
    local_78 = (uint *)((long)(int)uVar1 + (long)vl->reg_save_area);
    vl->gp_offset = uVar1 + 8;
  }
  else {
    local_78 = (uint *)vl->overflow_arg_area;
    vl->overflow_arg_area = local_78 + 2;
  }
  local_40 = *local_78;
  this->__zero = 0;
  local_38 = d0;
  local_34 = local_40;
  local_30 = local_3c;
  _z = d0;
  __y = vl;
  vl_local._4_4_ = d0;
  pcStack_18 = this;
  bVar2 = in_bound(this,&local_38,(int *)&local_3c,(int *)&local_40);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    this_local = (cartesian_cubic<short> *)
                 array_n<short,_3,_std::allocator<short>_>::operator()
                           (&this->_array,_z,(ulong)local_30,(ulong)local_34);
  }
  else {
    this_local = (cartesian_cubic<short> *)&this->__zero;
  }
  return (short *)this_local;
}

Assistant:

virtual T& operator()(int d0, va_list vl) {
            unsigned int _x = d0, _y = 0, _z = 0;
            _y = va_arg(vl, unsigned int);
            _z = va_arg(vl, unsigned int);

            __zero = 0;

            if(!in_bound(_x, _y, _z)) return __zero;
            return _array(_x, _y, _z);
        }